

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstDebugPrintfPass::GetStreamWriteFunctionId
          (InstDebugPrintfPass *this,uint32_t param_cnt)

{
  initializer_list<unsigned_int> __l;
  uint32_t uVar1;
  uint uVar2;
  Analysis preserved_analyses;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t operand1;
  mapped_type *pmVar6;
  IRContext *pIVar7;
  TypeManager *this_00;
  Type *pTVar8;
  type func;
  type pBVar9;
  Instruction *pIVar10;
  Instruction *this_01;
  pointer pFVar11;
  reference pvVar12;
  uint32_t func_id;
  undefined1 local_1b8 [8];
  string local_1b0;
  allocator<char> local_189;
  string local_188 [8];
  string name;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_160;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_158;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_150;
  uint local_144;
  uint32_t i;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_138;
  undefined1 local_130 [8];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  write_label;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  merge_label;
  uint32_t write_blk_id;
  uint32_t merge_blk_id;
  Instruction *obuf_safe_inst;
  Instruction *obuf_bnd_inst;
  Instruction *obuf_new_sz_inst;
  uint32_t obuf_curr_sz_id;
  Instruction *obuf_curr_sz_inst;
  uint32_t scope_invok_id;
  uint32_t mask_none_id;
  uint32_t obuf_record_sz_id;
  __node_base local_d8;
  __buckets_ptr local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  Instruction *local_b0;
  Instruction *obuf_curr_sz_ac_inst;
  uint32_t buf_uint_ptr_id;
  uint32_t buf_id;
  uint32_t obuf_record_sz;
  uint32_t first_param_offset;
  InstructionBuilder builder;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_70;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_blk_ptr
  ;
  vector<unsigned_int,_std::allocator<unsigned_int>_> param_ids;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> output_func;
  undefined1 local_40 [8];
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  Type *uint_type;
  TypeManager *type_mgr;
  InstDebugPrintfPass *pIStack_10;
  uint32_t param_cnt_local;
  InstDebugPrintfPass *this_local;
  
  type_mgr._4_4_ = param_cnt;
  pIStack_10 = this;
  pmVar6 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&(this->super_InstrumentPass).param2output_func_id_,
                        (key_type *)((long)&type_mgr + 4));
  if (*pmVar6 == 0) {
    uVar1 = Pass::TakeNextId((Pass *)this);
    pmVar6 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&(this->super_InstrumentPass).param2output_func_id_,
                          (key_type *)((long)&type_mgr + 4));
    *pmVar6 = uVar1;
    pIVar7 = Pass::context((Pass *)this);
    this_00 = IRContext::get_type_mgr(pIVar7);
    param_types.
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)InstrumentPass::GetInteger(&this->super_InstrumentPass,0x20,false);
    uVar2 = type_mgr._4_4_ + 2;
    std::allocator<const_spvtools::opt::analysis::Type_*>::allocator
              ((allocator<const_spvtools::opt::analysis::Type_*> *)
               ((long)&output_func._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                       .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 7));
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              *)local_40,(ulong)uVar2,
             (value_type *)
             &param_types.
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)
             ((long)&output_func._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                     .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 7));
    std::allocator<const_spvtools::opt::analysis::Type_*>::~allocator
              ((allocator<const_spvtools::opt::analysis::Type_*> *)
               ((long)&output_func._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                       .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 7));
    pmVar6 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&(this->super_InstrumentPass).param2output_func_id_,
                          (key_type *)((long)&type_mgr + 4));
    uVar2 = *pmVar6;
    pTVar8 = analysis::TypeManager::GetVoidType(this_00);
    func_id = (uint32_t)this;
    InstrumentPass::StartFunction
              ((InstrumentPass *)
               &param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,func_id,(Type *)(ulong)uVar2,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)pTVar8);
    func = std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
           operator*((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                      *)&param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    InstrumentPass::AddParameters
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_blk_ptr,
               &this->super_InstrumentPass,func,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)local_40);
    Pass::TakeNextId((Pass *)this);
    InstrumentPass::NewLabel((InstrumentPass *)&builder.preserved_analyses_,func_id);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&local_70,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&builder.preserved_analyses_);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&builder.preserved_analyses_);
    pIVar7 = Pass::context((Pass *)this);
    pBVar9 = std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::operator*(&local_70);
    preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)&obuf_record_sz,pIVar7,pBVar9,preserved_analyses);
    buf_id = 3;
    buf_uint_ptr_id = type_mgr._4_4_ + 3;
    obuf_curr_sz_ac_inst._4_4_ = GetOutputBufferId(this);
    uVar3 = GetOutputBufferPtrId(this);
    uVar1 = obuf_curr_sz_ac_inst._4_4_;
    obuf_curr_sz_ac_inst._0_4_ = uVar3;
    obuf_record_sz_id =
         InstructionBuilder::GetUintConstantId((InstructionBuilder *)&obuf_record_sz,1);
    local_d8._M_nxt = (_Hash_node_base *)&obuf_record_sz_id;
    local_d0 = (__buckets_ptr)0x1;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&mask_none_id + 3));
    __l._M_len = (size_type)local_d0;
    __l._M_array = (iterator)local_d8._M_nxt;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_c8,__l,(allocator_type *)((long)&mask_none_id + 3));
    pIVar10 = InstructionBuilder::AddAccessChain
                        ((InstructionBuilder *)&obuf_record_sz,uVar3,uVar1,&local_c8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c8);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&mask_none_id + 3));
    local_b0 = pIVar10;
    uVar1 = InstructionBuilder::GetUintConstantId
                      ((InstructionBuilder *)&obuf_record_sz,buf_uint_ptr_id);
    uVar3 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)&obuf_record_sz,0);
    uVar4 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)&obuf_record_sz,4);
    uVar5 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    operand1 = Instruction::result_id(local_b0);
    pIVar10 = InstructionBuilder::AddQuadOp
                        ((InstructionBuilder *)&obuf_record_sz,uVar5,OpAtomicIAdd,operand1,uVar4,
                         uVar3,uVar1);
    uVar1 = Instruction::result_id(pIVar10);
    uVar3 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar4 = InstructionBuilder::GetUintConstantId
                      ((InstructionBuilder *)&obuf_record_sz,buf_uint_ptr_id);
    pIVar10 = InstructionBuilder::AddIAdd((InstructionBuilder *)&obuf_record_sz,uVar3,uVar1,uVar4);
    uVar3 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar4 = GetOutputBufferId(this);
    this_01 = InstructionBuilder::AddIdLiteralOp
                        ((InstructionBuilder *)&obuf_record_sz,uVar3,OpArrayLength,uVar4,2);
    uVar3 = InstrumentPass::GetBoolId(&this->super_InstrumentPass);
    uVar4 = Instruction::result_id(pIVar10);
    uVar5 = Instruction::result_id(this_01);
    pIVar10 = InstructionBuilder::AddBinaryOp
                        ((InstructionBuilder *)&obuf_record_sz,uVar3,OpULessThanEqual,uVar4,uVar5);
    uVar3 = Pass::TakeNextId((Pass *)this);
    uVar4 = Pass::TakeNextId((Pass *)this);
    InstrumentPass::NewLabel((InstrumentPass *)&write_label,func_id);
    InstrumentPass::NewLabel((InstrumentPass *)local_130,func_id);
    uVar5 = Instruction::result_id(pIVar10);
    InstructionBuilder::AddConditionalBranch
              ((InstructionBuilder *)&obuf_record_sz,uVar5,uVar4,uVar3,uVar3,0);
    pFVar11 = std::
              unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
              operator->((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          *)&param_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    unique_ptr(&local_138,&local_70);
    Function::AddBasicBlock(pFVar11,&local_138);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_138);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&stack0xfffffffffffffec0,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_130);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    operator=(&local_70,
              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&stack0xfffffffffffffec0);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&stack0xfffffffffffffec0);
    pBVar9 = std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::operator*(&local_70);
    InstructionBuilder::SetInsertPoint((InstructionBuilder *)&obuf_record_sz,pBVar9);
    uVar4 = InstructionBuilder::GetUintConstantId
                      ((InstructionBuilder *)&obuf_record_sz,buf_uint_ptr_id);
    GenDebugOutputFieldCode(this,uVar1,0,uVar4,(InstructionBuilder *)&obuf_record_sz);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_blk_ptr,0);
    GenDebugOutputFieldCode(this,uVar1,1,*pvVar12,(InstructionBuilder *)&obuf_record_sz);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_blk_ptr,1);
    GenDebugOutputFieldCode(this,uVar1,2,*pvVar12,(InstructionBuilder *)&obuf_record_sz);
    for (local_144 = 0; local_144 < type_mgr._4_4_; local_144 = local_144 + 1) {
      uVar4 = local_144 + 3;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_blk_ptr,
                           (ulong)(local_144 + 2));
      GenDebugOutputFieldCode(this,uVar1,uVar4,*pvVar12,(InstructionBuilder *)&obuf_record_sz);
    }
    InstructionBuilder::AddBranch((InstructionBuilder *)&obuf_record_sz,uVar3);
    pFVar11 = std::
              unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
              operator->((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          *)&param_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    unique_ptr(&local_150,&local_70);
    Function::AddBasicBlock(pFVar11,&local_150);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_150);
    MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&local_158,&write_label);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    operator=(&local_70,&local_158);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_158);
    pBVar9 = std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::operator*(&local_70);
    InstructionBuilder::SetInsertPoint((InstructionBuilder *)&obuf_record_sz,pBVar9);
    InstructionBuilder::AddNullaryOp((InstructionBuilder *)&obuf_record_sz,0,OpReturn);
    pFVar11 = std::
              unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
              operator->((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          *)&param_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    unique_ptr(&local_160,&local_70);
    Function::AddBasicBlock(pFVar11,&local_160);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_160);
    pFVar11 = std::
              unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
              operator->((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          *)&param_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
    InstrumentPass::EndFunction((InstrumentPass *)((long)&name.field_2 + 8));
    Function::SetFunctionEnd
              (pFVar11,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)((long)&name.field_2 + 8));
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)((long)&name.field_2 + 8));
    pIVar7 = Pass::context((Pass *)this);
    IRContext::AddFunction
              (pIVar7,(unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                       *)&param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_188,"stream_write_",(allocator<char> *)(local_1b8 + 0x2f));
    std::allocator<char>::~allocator((allocator<char> *)(local_1b8 + 0x2f));
    std::__cxx11::to_string((string *)(local_1b8 + 8),type_mgr._4_4_);
    std::__cxx11::string::operator+=(local_188,(string *)(local_1b8 + 8));
    std::__cxx11::string::~string((string *)(local_1b8 + 8));
    pIVar7 = Pass::context((Pass *)this);
    pmVar6 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&(this->super_InstrumentPass).param2output_func_id_,
                          (key_type *)((long)&type_mgr + 4));
    NewGlobalName((InstDebugPrintfPass *)local_1b8,func_id,(string *)(ulong)*pmVar6);
    IRContext::AddDebug2Inst
              (pIVar7,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       *)local_1b8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)local_1b8);
    std::__cxx11::string::~string(local_188);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)local_130);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&write_label);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr(&local_70);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_blk_ptr);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&param_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::~vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
               *)local_40);
  }
  pmVar6 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&(this->super_InstrumentPass).param2output_func_id_,
                        (key_type *)((long)&type_mgr + 4));
  return *pmVar6;
}

Assistant:

uint32_t InstDebugPrintfPass::GetStreamWriteFunctionId(uint32_t param_cnt) {
  enum {
    kShaderId = 0,
    kInstructionIndex = 1,
    kFirstParam = 2,
  };
  // Total param count is common params plus validation-specific
  // params
  if (param2output_func_id_[param_cnt] == 0) {
    // Create function
    param2output_func_id_[param_cnt] = TakeNextId();
    analysis::TypeManager* type_mgr = context()->get_type_mgr();

    const analysis::Type* uint_type = GetInteger(32, false);

    std::vector<const analysis::Type*> param_types(kFirstParam + param_cnt,
                                                   uint_type);
    std::unique_ptr<Function> output_func = StartFunction(
        param2output_func_id_[param_cnt], type_mgr->GetVoidType(), param_types);

    std::vector<uint32_t> param_ids = AddParameters(*output_func, param_types);

    // Create first block
    auto new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(TakeNextId()));

    InstructionBuilder builder(
        context(), &*new_blk_ptr,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    // Gen test if debug output buffer size will not be exceeded.
    const uint32_t first_param_offset = kInstCommonOutInstructionIdx + 1;
    const uint32_t obuf_record_sz = first_param_offset + param_cnt;
    const uint32_t buf_id = GetOutputBufferId();
    const uint32_t buf_uint_ptr_id = GetOutputBufferPtrId();
    Instruction* obuf_curr_sz_ac_inst = builder.AddAccessChain(
        buf_uint_ptr_id, buf_id,
        {builder.GetUintConstantId(kDebugOutputSizeOffset)});
    // Fetch the current debug buffer written size atomically, adding the
    // size of the record to be written.
    uint32_t obuf_record_sz_id = builder.GetUintConstantId(obuf_record_sz);
    uint32_t mask_none_id =
        builder.GetUintConstantId(uint32_t(spv::MemoryAccessMask::MaskNone));
    uint32_t scope_invok_id =
        builder.GetUintConstantId(uint32_t(spv::Scope::Invocation));
    Instruction* obuf_curr_sz_inst = builder.AddQuadOp(
        GetUintId(), spv::Op::OpAtomicIAdd, obuf_curr_sz_ac_inst->result_id(),
        scope_invok_id, mask_none_id, obuf_record_sz_id);
    uint32_t obuf_curr_sz_id = obuf_curr_sz_inst->result_id();
    // Compute new written size
    Instruction* obuf_new_sz_inst =
        builder.AddIAdd(GetUintId(), obuf_curr_sz_id,
                        builder.GetUintConstantId(obuf_record_sz));
    // Fetch the data bound
    Instruction* obuf_bnd_inst =
        builder.AddIdLiteralOp(GetUintId(), spv::Op::OpArrayLength,
                               GetOutputBufferId(), kDebugOutputDataOffset);
    // Test that new written size is less than or equal to debug output
    // data bound
    Instruction* obuf_safe_inst = builder.AddBinaryOp(
        GetBoolId(), spv::Op::OpULessThanEqual, obuf_new_sz_inst->result_id(),
        obuf_bnd_inst->result_id());
    uint32_t merge_blk_id = TakeNextId();
    uint32_t write_blk_id = TakeNextId();
    std::unique_ptr<Instruction> merge_label(NewLabel(merge_blk_id));
    std::unique_ptr<Instruction> write_label(NewLabel(write_blk_id));
    (void)builder.AddConditionalBranch(
        obuf_safe_inst->result_id(), write_blk_id, merge_blk_id, merge_blk_id,
        uint32_t(spv::SelectionControlMask::MaskNone));
    // Close safety test block and gen write block
    output_func->AddBasicBlock(std::move(new_blk_ptr));
    new_blk_ptr = MakeUnique<BasicBlock>(std::move(write_label));
    builder.SetInsertPoint(&*new_blk_ptr);
    // Generate common and stage-specific debug record members
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutSize,
                            builder.GetUintConstantId(obuf_record_sz),
                            &builder);
    // Store Shader Id
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutShaderId,
                            param_ids[kShaderId], &builder);
    // Store Instruction Idx
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutInstructionIdx,
                            param_ids[kInstructionIndex], &builder);
    // Gen writes of validation specific data
    for (uint32_t i = 0; i < param_cnt; ++i) {
      GenDebugOutputFieldCode(obuf_curr_sz_id, first_param_offset + i,
                              param_ids[kFirstParam + i], &builder);
    }
    // Close write block and gen merge block
    (void)builder.AddBranch(merge_blk_id);
    output_func->AddBasicBlock(std::move(new_blk_ptr));
    new_blk_ptr = MakeUnique<BasicBlock>(std::move(merge_label));
    builder.SetInsertPoint(&*new_blk_ptr);
    // Close merge block and function and add function to module
    (void)builder.AddNullaryOp(0, spv::Op::OpReturn);

    output_func->AddBasicBlock(std::move(new_blk_ptr));
    output_func->SetFunctionEnd(EndFunction());
    context()->AddFunction(std::move(output_func));

    std::string name("stream_write_");
    name += std::to_string(param_cnt);

    context()->AddDebug2Inst(
        NewGlobalName(param2output_func_id_[param_cnt], name));
  }
  return param2output_func_id_[param_cnt];
}